

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ssize_t __thiscall
nanovdb::io::GridMetaData::read(GridMetaData *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t extraout_RAX;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  long *plVar1;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp;
  
  plVar1 = (long *)CONCAT44(in_register_00000034,__fd);
  std::istream::read((char *)plVar1,(long)this);
  tmp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 operator_new__((ulong)(this->super_MetaData).nameSize);
  std::istream::read((char *)plVar1,
                     (long)tmp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl);
  std::__cxx11::string::assign((char *)&this->gridName);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&tmp);
    return extraout_RAX;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Failed reading GridMetaData");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void GridMetaData::read(std::istream& is)
{
    is.read(reinterpret_cast<char*>(this), sizeof(MetaData));
    std::unique_ptr<char[]> tmp(new char[nameSize]);
    is.read(reinterpret_cast<char*>(tmp.get()), nameSize);
    gridName.assign(tmp.get());
    if (!is)
        throw std::runtime_error("Failed reading GridMetaData");
}